

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  sqlite3_vtab *psVar1;
  Fts3Table *pTab;
  sqlite_int64 iValue;
  Fts3Expr *pExpr;
  bool bVar2;
  Fts3Cursor *pCsr_00;
  Fts3Cursor *pFVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar *pX;
  byte *pbVar8;
  size_t sVar9;
  size_t sVar10;
  MatchinfoBuffer *pMVar11;
  u8 *z;
  Mem *pMVar12;
  byte *pbVar13;
  LcsIterator *pCtx;
  uint uVar14;
  ulong uVar15;
  LcsIterator *pLVar16;
  uint uVar17;
  bool bVar18;
  int iVar19;
  char **ppOut;
  LcsIterator *pIter;
  uchar *pStart;
  byte *pbVar20;
  int iVar21;
  int iVar22;
  byte *__s2;
  long lVar23;
  long lVar24;
  long lVar25;
  long in_FS_OFFSET;
  bool bVar26;
  Fts3Cursor *pCsr;
  MatchInfo sInfo;
  char *pEnd;
  char *a;
  int nPhrase;
  int rc;
  int iPhrase;
  _func_void_void_ptr *local_f0;
  long local_c8;
  Fts3Cursor *local_a0;
  MatchInfo local_98;
  undefined1 *local_70;
  char *local_68;
  undefined8 local_60;
  sqlite3_stmt *local_58;
  int local_4c;
  Fts3Cursor *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = (Fts3Cursor *)&DAT_aaaaaaaaaaaaaaaa;
  iVar5 = fts3FunctionArg(pContext,"matchinfo",*apVal,&local_a0);
  if (iVar5 == 0) {
    if (nVal < 2) {
      pbVar8 = (byte *)0x0;
    }
    else {
      pbVar8 = (byte *)sqlite3ValueText(apVal[1],'\x01');
    }
    pCsr_00 = local_a0;
    __s2 = (byte *)"pcx";
    if (pbVar8 != (byte *)0x0) {
      __s2 = pbVar8;
    }
    if (local_a0->pExpr == (Fts3Expr *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setResultStrOrError(pContext,"",0,'\0',(_func_void_void_ptr *)0x0);
        return;
      }
      goto LAB_001d7b73;
    }
    psVar1 = (local_a0->base).pVtab;
    local_98.nDoc = 0;
    local_98.flag = '\0';
    local_98._25_7_ = 0;
    local_98.aMatchinfo = (u32 *)0x0;
    local_98.pCursor = local_a0;
    local_98.nPhrase = 0;
    local_98.nCol = *(uint *)&psVar1[2].pModule;
    pMVar11 = local_a0->pMIBuffer;
    if ((pMVar11 != (MatchinfoBuffer *)0x0) &&
       (iVar5 = strcmp(pMVar11->zMatchinfo,(char *)__s2), iVar5 != 0)) {
      pMVar11->aRef[0] = '\0';
      if ((pMVar11->aRef[1] == '\0') && (pMVar11->aRef[2] == '\0')) {
        sqlite3_free(pMVar11);
      }
      pCsr_00->pMIBuffer = (MatchinfoBuffer *)0x0;
    }
    bVar18 = false;
    iVar5 = 0;
    if (pCsr_00->pMIBuffer == (MatchinfoBuffer *)0x0) {
      lVar24 = 0;
      local_58 = (sqlite3_stmt *)((ulong)local_58 & 0xffffffff00000000);
      local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
      fts3ExprIterate2(pCsr_00->pExpr,(int *)&local_48,fts3ExprPhraseCountCb,&local_58);
      pCsr_00->nPhrase = (int)local_58;
      local_98.nPhrase = (int)local_58;
      bVar4 = *__s2;
      bVar26 = bVar4 == 0;
      if (!bVar26) {
        bVar26 = false;
        lVar24 = 0;
        pbVar8 = __s2;
        do {
          local_48 = (Fts3Cursor *)0x0;
          bVar18 = true;
          uVar14 = bVar4 - 0x62;
          if (uVar14 < 0x18) {
            if ((0xc24003U >> (uVar14 & 0x1f) & 1) == 0) {
              if (uVar14 == 10) {
LAB_001d70ce:
                if ((*(char *)((long)&psVar1[0x13].pModule + 6) == '\0') &&
                   ((0x17 < uVar14 || ((0xc00001U >> (uVar14 & 0x1f) & 1) == 0))))
                goto LAB_001d70f3;
              }
              else {
                if (uVar14 != 0xc) goto LAB_001d709f;
                if (*(char *)((long)&psVar1[0x13].pModule + 4) == '\0') {
                  uVar17 = bVar4 - 0x61;
                  if (uVar17 < 0x19) {
                    if ((0x1840002U >> (uVar17 & 0x1f) & 1) != 0) goto LAB_001d6ff0;
                    if (uVar17 == 0) goto LAB_001d70a4;
                    if (uVar17 == 0xb) goto LAB_001d70ce;
                  }
                  goto LAB_001d70f3;
                }
              }
            }
          }
          else {
LAB_001d709f:
            if (bVar4 == 0x61) {
LAB_001d70a4:
              if (*(char *)((long)&psVar1[0x13].pModule + 4) != '\0') goto LAB_001d6ff0;
              if (uVar14 < 0x18) {
                if ((0xc20001U >> (uVar14 & 0x1f) & 1) != 0) goto LAB_001d6ff0;
                if (uVar14 == 10) goto LAB_001d70ce;
              }
            }
LAB_001d70f3:
            bVar18 = false;
            sqlite3Fts3ErrMsg((char **)&local_48,"unrecognized matchinfo request: %c",
                              (ulong)(uint)(int)(char)bVar4);
          }
LAB_001d6ff0:
          pFVar3 = local_48;
          if (!bVar18) {
            pContext->isError = 1;
            sqlite3VdbeMemSetStr
                      (pContext->pOut,(char *)local_48,-1,'\x01',
                       (_func_void_void_ptr *)0xffffffffffffffff);
            sqlite3_free(pFVar3);
            bVar18 = false;
            iVar5 = 0;
            goto LAB_001d7205;
          }
          sVar9 = fts3MatchinfoSize(&local_98,*pbVar8);
          lVar24 = lVar24 + sVar9;
          bVar4 = pbVar8[1];
          bVar26 = bVar4 == 0;
          pbVar8 = pbVar8 + 1;
        } while (!bVar26);
      }
      sVar10 = strlen((char *)__s2);
      pMVar11 = (MatchinfoBuffer *)sqlite3Fts3MallocZero(sVar10 + lVar24 * 8 + 0x25);
      if (pMVar11 == (MatchinfoBuffer *)0x0) {
        iVar5 = 7;
      }
      else {
        pMVar11->aMatchinfo[0] = 0x1c;
        pMVar11->aMatchinfo[lVar24 + 1] = (int)((lVar24 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
        pMVar11->nElem = (int)lVar24;
        pMVar11->zMatchinfo = (char *)(pMVar11[1].aRef + lVar24 * 8 + 4);
        memcpy(pMVar11[1].aRef + lVar24 * 8 + 4,__s2,sVar10 + 1);
        pMVar11->aRef[0] = '\x01';
        iVar5 = 0;
      }
      pCsr_00->pMIBuffer = pMVar11;
      pCsr_00->isMatchinfoNeeded = 1;
      bVar18 = true;
LAB_001d7205:
      if (bVar26) goto LAB_001d720e;
    }
    else {
LAB_001d720e:
      bVar26 = true;
      if (iVar5 != 0) {
        z = (u8 *)0x0;
        local_f0 = (_func_void_void_ptr *)0x0;
        goto LAB_001d72f1;
      }
      pMVar11 = pCsr_00->pMIBuffer;
      if (pMVar11->aRef[1] == '\0') {
        pMVar11->aRef[1] = '\x01';
        z = &pMVar11->field_0x1c;
        local_f0 = fts3MIBufferFree;
LAB_001d72e9:
        bVar26 = false;
        iVar5 = 0;
      }
      else {
        if (pMVar11->aRef[2] == '\0') {
          pMVar11->aRef[2] = '\x01';
          z = pMVar11[1].aRef + (long)pMVar11->nElem * 4;
          local_f0 = fts3MIBufferFree;
          goto LAB_001d72e9;
        }
        iVar5 = pMVar11->nElem;
        iVar7 = sqlite3_initialize();
        if (iVar7 == 0) {
          z = (u8 *)sqlite3Malloc((long)iVar5 << 2);
        }
        else {
          z = (u8 *)0x0;
        }
        iVar5 = 0;
        if (z == (u8 *)0x0) {
          iVar5 = 7;
          z = (u8 *)0x0;
          local_f0 = (_func_void_void_ptr *)0x0;
        }
        else {
          local_f0 = sqlite3_free;
          if (pMVar11->bGlobal != 0) {
            memcpy(z,&pMVar11->field_0x1c,(long)pMVar11->nElem << 2);
            goto LAB_001d72e9;
          }
          bVar26 = false;
        }
      }
LAB_001d72f1:
      if (iVar5 == 0) {
        local_98.nPhrase = pCsr_00->nPhrase;
        local_4c = 0;
        pTab = (Fts3Table *)(pCsr_00->base).pVtab;
        local_58 = (sqlite3_stmt *)0x0;
        bVar4 = *__s2;
        local_98.aMatchinfo = (u32 *)z;
        if (bVar4 != 0) {
          lVar24 = 0;
          do {
            local_98.flag = bVar4;
            iVar5 = local_4c;
            if (bVar4 < 0x6c) {
              if (bVar4 == 0x61) {
                if (bVar18) {
                  local_48 = (Fts3Cursor *)&DAT_aaaaaaaaaaaaaaaa;
                  local_60 = &DAT_aaaaaaaaaaaaaaaa;
                  local_68 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar7 = fts3MatchinfoSelectDoctotal
                                    (pTab,&local_58,(sqlite3_int64 *)&local_48,(char **)&local_60,
                                     &local_68);
                  pFVar3 = local_48;
                  iVar5 = iVar7;
                  if ((iVar7 == 0) && (0 < local_98.nCol)) {
                    lVar23 = (long)local_48 / 2;
                    lVar25 = 0;
                    local_4c = 0;
                    do {
                      local_70 = &DAT_aaaaaaaaaaaaaaaa;
                      iVar5 = sqlite3Fts3GetVarintU(local_60,(sqlite_uint64 *)&local_70);
                      local_60 = local_60 + iVar5;
                      iVar5 = 0x10b;
                      if (local_68 < local_60) break;
                      *(int *)((long)local_98.aMatchinfo + lVar25 * 4) =
                           (int)((long)(((ulong)local_70 & 0xffffffff) + lVar23) / (long)pFVar3);
                      lVar25 = lVar25 + 1;
                      iVar5 = iVar7;
                    } while (lVar25 < local_98.nCol);
                  }
                }
              }
              else {
                if (bVar4 == 0x62) goto LAB_001d7527;
                if (bVar4 != 99) goto switchD_001d7372_caseD_6d;
                if (bVar18) {
                  iVar5 = local_98.nCol;
                  goto LAB_001d78f7;
                }
              }
            }
            else {
              switch(bVar4) {
              case 0x6c:
                iValue = pCsr_00->iPrevId;
                local_48 = (Fts3Cursor *)0x0;
                iVar5 = fts3SqlStmt(pTab,0x15,(sqlite3_stmt **)&local_48,(sqlite3_value **)0x0);
                pFVar3 = local_48;
                if (iVar5 == 0) {
                  sqlite3_bind_int64((sqlite3_stmt *)local_48,1,iValue);
                  iVar5 = sqlite3_step((sqlite3_stmt *)pFVar3);
                  if (iVar5 == 100) {
                    iVar5 = 0;
                    pMVar12 = columnMem((sqlite3_stmt *)pFVar3,0);
                    uVar14._0_2_ = pMVar12->flags;
                    uVar14._2_1_ = pMVar12->enc;
                    uVar14._3_1_ = pMVar12->eSubtype;
                    columnMallocFailure((sqlite3_stmt *)pFVar3);
                    if ((0x1000000010001U >> ((ulong)uVar14 & 0x3f) & 1) != 0) goto LAB_001d7414;
                  }
                  iVar5 = sqlite3_reset((sqlite3_stmt *)pFVar3);
                  if (iVar5 == 0) {
                    iVar5 = 0x10b;
                  }
                  local_48 = (Fts3Cursor *)0x0;
                }
LAB_001d7414:
                pFVar3 = local_48;
                local_4c = iVar5;
                if (iVar5 == 0) {
                  pMVar12 = columnMem((sqlite3_stmt *)local_48,0);
                  pbVar8 = (byte *)sqlite3_value_blob(pMVar12);
                  columnMallocFailure((sqlite3_stmt *)pFVar3);
                  iVar7 = sqlite3_column_bytes((sqlite3_stmt *)pFVar3,0);
                  local_4c = iVar5;
                  if (0 < local_98.nCol) {
                    pbVar13 = pbVar8 + iVar7;
                    lVar23 = 0;
                    do {
                      iVar7 = (int)pbVar8 + 10;
                      uVar15 = 0xfffffffffffffff9;
                      lVar25 = 0;
                      pbVar20 = pbVar8;
                      do {
                        if (pbVar20 < pbVar13) {
                          uVar14 = (uint)*pbVar20;
                        }
                        else {
                          uVar14 = 0;
                        }
                        uVar15 = uVar15 + 7;
                        lVar25 = lVar25 + ((ulong)(uVar14 & 0x7f) << ((byte)uVar15 & 0x3f));
                        pbVar20 = pbVar20 + 1;
                        if (uVar14 < 0x80) {
                          iVar7 = (int)pbVar20;
                          break;
                        }
                      } while (uVar15 < 0x39);
                      pbVar8 = pbVar8 + (iVar7 - (int)pbVar8);
                      local_4c = 0x10b;
                      if (pbVar13 < pbVar8) break;
                      *(int *)((long)local_98.aMatchinfo + lVar23 * 4) = (int)lVar25;
                      lVar23 = lVar23 + 1;
                      local_4c = iVar5;
                    } while (lVar23 < local_98.nCol);
                  }
                }
                sqlite3_reset((sqlite3_stmt *)pFVar3);
                iVar5 = local_4c;
                break;
              case 0x6d:
              case 0x6f:
              case 0x71:
              case 0x72:
switchD_001d7372_caseD_6d:
                pExpr = pCsr_00->pExpr;
                uStack_40 = 0;
                local_60 = (char *)((ulong)local_60._4_4_ << 0x20);
                local_48 = pCsr_00;
                local_4c = fts3ExprIterate2(pExpr,(int *)&local_60,fts3ExprLoadDoclistsCb,&local_48)
                ;
                iVar5 = local_4c;
                if (local_4c == 0) {
                  if (bVar18) {
                    iVar5 = 0;
                    if ((pCsr_00->pDeferred == (Fts3DeferredToken *)0x0) ||
                       (iVar5 = fts3MatchinfoSelectDoctotal
                                          (pTab,&local_58,&local_98.nDoc,(char **)0x0,(char **)0x0),
                       iVar5 == 0)) {
                      local_4c = iVar5;
                      local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                      local_4c = fts3ExprIterate2(pExpr,(int *)&local_48,fts3ExprGlobalHitsCb,
                                                  &local_98);
                      sqlite3Fts3EvalTestDeferred(pCsr_00,&local_4c);
                      iVar5 = local_4c;
                      if (local_4c == 0) goto LAB_001d763f;
                    }
                  }
                  else {
LAB_001d763f:
                    local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                    fts3ExprIterate2(pExpr,(int *)&local_48,fts3ExprLocalHitsCb,&local_98);
                    iVar5 = local_4c;
                  }
                }
                break;
              case 0x6e:
                if (bVar18) {
                  local_48 = (Fts3Cursor *)0x0;
                  local_4c = fts3MatchinfoSelectDoctotal
                                       (pTab,&local_58,(sqlite3_int64 *)&local_48,(char **)0x0,
                                        (char **)0x0);
                  iVar5 = (int)local_48;
LAB_001d78f7:
                  *local_98.aMatchinfo = iVar5;
                  iVar5 = local_4c;
                }
                break;
              case 0x70:
                if (bVar18) {
                  iVar5 = local_98.nPhrase;
                  goto LAB_001d78f7;
                }
                break;
              case 0x73:
                uStack_40 = 0;
                local_60 = (char *)((ulong)local_60._4_4_ << 0x20);
                local_48 = pCsr_00;
                local_4c = fts3ExprIterate2(pCsr_00->pExpr,(int *)&local_60,fts3ExprLoadDoclistsCb,
                                            &local_48);
                iVar5 = local_4c;
                if (local_4c == 0) {
                  pCtx = (LcsIterator *)sqlite3Fts3MallocZero((long)pCsr_00->nPhrase << 5);
                  if (pCtx == (LcsIterator *)0x0) {
                    iVar5 = 7;
                  }
                  else {
                    local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                    fts3ExprIterate2(pCsr_00->pExpr,(int *)&local_48,fts3MatchinfoLcsCb,pCtx);
                    if (0 < (long)local_98.nPhrase) {
                      lVar23 = 0;
                      iVar5 = 0;
                      do {
                        iVar5 = iVar5 - *(int *)(*(long *)(*(long *)((long)&pCtx->pExpr + lVar23) +
                                                          0x20) + 0x50);
                        *(int *)((long)&pCtx->iPosOffset + lVar23) = iVar5;
                        lVar23 = lVar23 + 0x20;
                      } while ((long)local_98.nPhrase * 0x20 != lVar23);
                    }
                    if (local_98.nCol < 1) {
                      iVar5 = 0;
                    }
                    else {
                      local_c8 = 0;
                      iVar5 = 0;
                      do {
                        iVar7 = 0;
                        if (0 < local_98.nPhrase) {
                          lVar23 = 0;
                          iVar7 = 0;
                          ppOut = &pCtx->pRead;
                          do {
                            iVar5 = sqlite3Fts3EvalPhrasePoslist
                                              (pCsr_00,((LcsIterator *)(ppOut + -2))->pExpr,
                                               (int)local_c8,ppOut);
                            iVar21 = 0xb;
                            if (iVar5 == 0) {
                              bVar2 = true;
                              if (*ppOut != (char *)0x0) {
                                *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                                fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                                if (*ppOut == (char *)0x0) {
                                  iVar5 = 0x10b;
                                  bVar2 = false;
                                  goto LAB_001d77c6;
                                }
                                iVar7 = iVar7 + 1;
                              }
                              iVar5 = 0;
                              iVar21 = 0;
                            }
                            else {
                              bVar2 = false;
                            }
LAB_001d77c6:
                            if (!bVar2) goto LAB_001d7871;
                            lVar23 = lVar23 + 1;
                            ppOut = ppOut + 4;
                          } while (lVar23 < local_98.nPhrase);
                        }
                        iVar21 = 0;
                        iVar19 = 0;
                        if (0 < iVar7) {
                          iVar19 = 0;
                          do {
                            lVar23 = (long)local_98.nPhrase;
                            if (lVar23 < 1) {
                              pIter = (LcsIterator *)0x0;
                            }
                            else {
                              iVar6 = 0;
                              pIter = (LcsIterator *)0x0;
                              pLVar16 = pCtx;
                              do {
                                if (pLVar16->pRead == (char *)0x0) {
                                  iVar6 = 0;
                                }
                                else {
                                  if ((pIter == (LcsIterator *)0x0) || (pLVar16->iPos < pIter->iPos)
                                     ) {
                                    pIter = pLVar16;
                                  }
                                  if ((iVar6 == 0) ||
                                     (iVar22 = 1, pLVar16->iPos == pLVar16[-1].iPos)) {
                                    iVar22 = iVar6 + 1;
                                  }
                                  iVar6 = iVar22;
                                  if (iVar19 < iVar6) {
                                    iVar19 = iVar6;
                                  }
                                }
                                pLVar16 = pLVar16 + 1;
                                lVar23 = lVar23 + -1;
                              } while (lVar23 != 0);
                            }
                            iVar6 = fts3LcsIteratorAdvance(pIter);
                            iVar22 = iVar7 - iVar6;
                            bVar2 = iVar6 <= iVar7;
                            iVar7 = iVar22;
                          } while (iVar22 != 0 && bVar2);
                        }
                        *(int *)((long)local_98.aMatchinfo + local_c8 * 4) = iVar19;
LAB_001d7871:
                        if (iVar21 != 0) {
                          if (iVar21 != 0xb) goto LAB_001d7a54;
                          break;
                        }
                        local_c8 = local_c8 + 1;
                      } while (local_c8 < local_98.nCol);
                    }
                    sqlite3_free(pCtx);
                  }
                }
                break;
              default:
                if (bVar4 != 0x79) goto switchD_001d7372_caseD_6d;
LAB_001d7527:
                sVar9 = fts3MatchinfoSize(&local_98,bVar4);
                memset(local_98.aMatchinfo,0,sVar9 * 4);
                iVar5 = fts3ExprLHitGather(pCsr_00->pExpr,&local_98);
              }
            }
LAB_001d7a54:
            local_4c = iVar5;
            sVar9 = fts3MatchinfoSize(&local_98,__s2[lVar24]);
            local_98.aMatchinfo = (u32 *)((long)local_98.aMatchinfo + sVar9 * 4);
            if (local_4c != 0) break;
            bVar4 = __s2[lVar24 + 1];
            lVar24 = lVar24 + 1;
          } while (bVar4 != 0);
        }
        iVar5 = local_4c;
        sqlite3_reset(local_58);
        if (bVar18) {
          pMVar11 = pCsr_00->pMIBuffer;
          pMVar11->bGlobal = 1;
          memcpy(pMVar11[1].aRef + (long)pMVar11->nElem * 4,&pMVar11->field_0x1c,
                 (long)pMVar11->nElem << 2);
        }
      }
      if (iVar5 == 0) {
        setResultStrOrError(pContext,(char *)z,pCsr_00->pMIBuffer->nElem << 2,'\0',local_f0);
      }
      else {
        sqlite3_result_error_code(pContext,iVar5);
        if (!bVar26) {
          (*local_f0)(z);
        }
      }
    }
    sqlite3_blob_close((sqlite3_blob *)psVar1[0x14].pModule);
    psVar1[0x14].pModule = (sqlite3_module *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d7b73:
  __stack_chk_fail();
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}